

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O0

LispPTR N_OP_putbitsnfd(LispPTR base,LispPTR data,int word_offset,int beta)

{
  ushort uVar1;
  DLword *pDVar2;
  byte bVar3;
  int fmask;
  int field_size;
  int shift_size;
  DLword *pword;
  int beta_local;
  int word_offset_local;
  LispPTR data_local;
  LispPTR base_local;
  
  if ((data & 0xfff0000) == 0xe0000) {
    pDVar2 = NativeAligned2FromLAddr(base + word_offset);
    bVar3 = ('\x0f' - (char)(beta >> 4)) - (char)(beta & 0xfU);
    uVar1 = (ushort)(mask_array[(int)(beta & 0xfU)] << (bVar3 & 0x1f));
    *(ushort *)((ulong)pDVar2 ^ 2) =
         (ushort)(data << (bVar3 & 0x1f)) & uVar1 |
         *(ushort *)((ulong)pDVar2 ^ 2) & (uVar1 ^ 0xffff);
    data_local = base;
  }
  else {
    MachineState.errorexit = 1;
    data_local = 0xffffffff;
    MachineState.tosvalue = data;
  }
  return data_local;
}

Assistant:

LispPTR N_OP_putbitsnfd(LispPTR base, LispPTR data, int word_offset,
                        int beta) {
  DLword *pword;
  int shift_size, field_size, fmask;

#ifdef CHECK
  if (base > POINTERMASK) { error("getbits: base out of range"); }
  if (beta > 0xFF) { error("bad beta argument to PUTBITS"); }
#endif

  if ((SEGMASK & data) != S_POSITIVE) { ERROR_EXIT(data); }

  pword = NativeAligned2FromLAddr(base + word_offset);
  field_size = 0xF & beta;
  shift_size = 15 - (beta >> 4) - field_size;
  fmask = mask_array[field_size] << shift_size;
  GETWORD(pword) = ((data << shift_size) & fmask) | (GETWORD(pword) & (~fmask));

  return (base);
}